

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_pspr.cpp
# Opt level: O1

void P_FireWeapon(player_t *player,FState *state)

{
  DBot *pDVar1;
  AWeapon *this;
  bool bVar2;
  DPSprite *this_00;
  
  pDVar1 = (player->Bot).field_0.p;
  if (pDVar1 != (DBot *)0x0) {
    if (((pDVar1->super_DThinker).super_DObject.ObjectFlags & 0x20) == 0) goto LAB_00439686;
    (player->Bot).field_0.p = (DBot *)0x0;
  }
  if (bot_observer.Value != false) {
    return;
  }
LAB_00439686:
  this = player->ReadyWeapon;
  if ((this != (AWeapon *)0x0) && (bVar2 = AWeapon::CheckAmmo(this,0,true,false,-1), bVar2)) {
    APlayerPawn::PlayAttacking(player->mo);
    this->bAltFire = false;
    if (state == (FState *)0x0) {
      state = AWeapon::GetAtkState(this,player->refire != 0);
    }
    this_00 = player_t::GetPSprite(player,PSP_WEAPON);
    DPSprite::SetState(this_00,state,false);
    if (((this->super_AStateProvider).super_AInventory.field_0x4fc & 0x10) == 0) {
      P_NoiseAlert(&player->mo->super_AActor,&player->mo->super_AActor,false,0.0);
      return;
    }
  }
  return;
}

Assistant:

void P_FireWeapon (player_t *player, FState *state)
{
	AWeapon *weapon;

	// [SO] 9/2/02: People were able to do an awful lot of damage
	// when they were observers...
	if (player->Bot == nullptr && bot_observer)
	{
		return;
	}

	weapon = player->ReadyWeapon;
	if (weapon == nullptr || !weapon->CheckAmmo (AWeapon::PrimaryFire, true))
	{
		return;
	}

	player->mo->PlayAttacking ();
	weapon->bAltFire = false;
	if (state == nullptr)
	{
		state = weapon->GetAtkState(!!player->refire);
	}
	P_SetPsprite(player, PSP_WEAPON, state);
	if (!(weapon->WeaponFlags & WIF_NOALERT))
	{
		P_NoiseAlert (player->mo, player->mo, false);
	}
}